

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestDyndepLoadExtraEntry::Run(GraphTestDyndepLoadExtraEntry *this)

{
  Test *pTVar1;
  bool bVar2;
  bool bVar3;
  Node *pNVar4;
  allocator<char> local_e1;
  string local_e0;
  uint local_c0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string err;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ManifestParserOptions local_18;
  GraphTestDyndepLoadExtraEntry *local_10;
  GraphTestDyndepLoadExtraEntry *this_local;
  
  local_10 = this;
  ManifestParserOptions::ManifestParserOptions(&local_18);
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nbuild out: r in || dd\n  dyndep = dd\nbuild out2: r in || dd\n"
              ,local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dd",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ninja_dyndep_version = 1\nbuild out: dyndep\nbuild out2: dyndep\n"
             ,(allocator<char> *)(err.field_2._M_local_buf + 0xf));
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)local_98);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"dd",&local_b9);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_b8);
  bVar2 = Node::dyndep_pending(pNVar4);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x230,"GetNode(\"dd\")->dyndep_pending()");
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pTVar1 = g_current_test;
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"dd",&local_e1);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_e0);
    bVar3 = DependencyScan::LoadDyndeps(&(this->super_GraphTest).scan_,pNVar4,(string *)local_98);
    testing::Test::Check
              (pTVar1,(bool)(~bVar3 & 1),
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x231,"scan_.LoadDyndeps(GetNode(\"dd\"), &err)");
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("dyndep file \'dd\' mentions output \'out2\' whose build statement does not have a dyndep binding for the file"
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x233,
               "\"dyndep file \'dd\' mentions output \'out2\' whose build statement \" \"does not have a dyndep binding for the file\" == err"
              );
  }
  local_c0 = (uint)bVar2;
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

TEST_F(GraphTest, DyndepLoadExtraEntry) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out: r in || dd\n"
"  dyndep = dd\n"
"build out2: r in || dd\n"
  );
  fs_.Create("dd",
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
"build out2: dyndep\n"
  );

  string err;
  ASSERT_TRUE(GetNode("dd")->dyndep_pending());
  EXPECT_FALSE(scan_.LoadDyndeps(GetNode("dd"), &err));
  EXPECT_EQ("dyndep file 'dd' mentions output 'out2' whose build statement "
            "does not have a dyndep binding for the file", err);
}